

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O2

void __thiscall
spvtools::utils::SmallVector<unsigned_int,_2UL>::SmallVector
          (SmallVector<unsigned_int,_2UL> *this,initializer_list<unsigned_int> init_list)

{
  pointer __p;
  size_t sVar1;
  long lVar2;
  initializer_list<unsigned_int> init_list_local;
  pointer local_18;
  
  init_list_local._M_len = init_list._M_len;
  init_list_local._M_array = init_list._M_array;
  this->_vptr_SmallVector = (_func_int **)&PTR__SmallVector_003adc78;
  this->size_ = 0;
  this->small_data_ = (uint *)this->buffer;
  (this->large_data_)._M_t.
  super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  if (init_list_local._M_len < 2) {
    sVar1 = 1;
    for (lVar2 = 0; init_list_local._M_len * 4 != lVar2; lVar2 = lVar2 + 4) {
      this->size_ = sVar1;
      *(undefined4 *)(this->buffer[0].data._M_elems + lVar2) =
           *(undefined4 *)((long)init_list_local._M_array + lVar2);
      sVar1 = sVar1 + 1;
    }
  }
  else {
    MakeUnique<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::initializer_list<unsigned_int>>
              ((spvtools *)&local_18,&init_list_local);
    __p = local_18;
    local_18 = (pointer)0x0;
    std::
    __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&this->large_data_,__p);
    std::
    unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)&local_18);
  }
  return;
}

Assistant:

SmallVector(std::initializer_list<T> init_list) : SmallVector() {
    if (init_list.size() < small_size) {
      for (auto it = init_list.begin(); it != init_list.end(); ++it) {
        new (small_data_ + (size_++)) T(std::move(*it));
      }
    } else {
      large_data_ = MakeUnique<std::vector<T>>(std::move(init_list));
    }
  }